

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O2

uint32_t __thiscall BIP324Cipher::DecryptLength(BIP324Cipher *this,Span<const_std::byte> input)

{
  long lVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> input_00;
  Span<std::byte> output;
  byte buf [3];
  
  input_00.m_data = input.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (input.m_size != 3) {
    __assert_fail("input.size() == LENGTH_LEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x5b,"uint32_t BIP324Cipher::DecryptLength(Span<const std::byte>)");
  }
  input_00.m_size = 3;
  output.m_size = 3;
  output.m_data = buf;
  FSChaCha20::Crypt((FSChaCha20 *)&this->m_recv_l_cipher,input_00,output);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uint)(uint3)buf;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t BIP324Cipher::DecryptLength(Span<const std::byte> input) noexcept
{
    assert(input.size() == LENGTH_LEN);

    std::byte buf[LENGTH_LEN];
    // Decrypt length
    m_recv_l_cipher->Crypt(input, buf);
    // Convert to number.
    return uint32_t(buf[0]) + (uint32_t(buf[1]) << 8) + (uint32_t(buf[2]) << 16);
}